

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

optional<cmLinkItem> * __thiscall
cmGeneratorTarget::LookupLinkItem
          (optional<cmLinkItem> *__return_storage_ptr__,cmGeneratorTarget *this,string *n,
          cmListFileBacktrace *bt,LookupLinkItemScope *scope,LookupSelf lookupSelf)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  string *__rhs;
  cmListFileBacktrace local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d8;
  cmLinkItem local_a8;
  undefined1 local_68 [8];
  string name;
  LookupSelf lookupSelf_local;
  LookupLinkItemScope *scope_local;
  cmListFileBacktrace *bt_local;
  string *n_local;
  cmGeneratorTarget *this_local;
  optional<cmLinkItem> *maybeItem;
  
  std::optional<cmLinkItem>::optional(__return_storage_ptr__);
  bVar1 = IsLinkLookupScope(this,n,&scope->LG);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  CheckCMP0004((string *)local_68,this,n);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if (lookupSelf == No) {
      __rhs = GetName_abi_cxx11_(this);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,__rhs);
      if (_Var2) goto LAB_0082bd6e;
    }
    std::__cxx11::string::string((string *)&local_f8,(string *)local_68);
    cmListFileBacktrace::cmListFileBacktrace(&local_108,bt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_d8,&local_f8,&local_108);
    ResolveLinkItem(&local_a8,this,&local_d8,scope->LG);
    std::optional<cmLinkItem>::operator=(__return_storage_ptr__,&local_a8);
    cmLinkItem::~cmLinkItem(&local_a8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_d8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_108);
    std::__cxx11::string::~string((string *)&local_f8);
  }
LAB_0082bd6e:
  name.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmLinkItem> cmGeneratorTarget::LookupLinkItem(
  std::string const& n, cmListFileBacktrace const& bt,
  LookupLinkItemScope* scope, LookupSelf lookupSelf) const
{
  cm::optional<cmLinkItem> maybeItem;
  if (this->IsLinkLookupScope(n, scope->LG)) {
    return maybeItem;
  }

  std::string name = this->CheckCMP0004(n);
  if (name.empty() ||
      (lookupSelf == LookupSelf::No && name == this->GetName())) {
    return maybeItem;
  }
  maybeItem = this->ResolveLinkItem(BT<std::string>(name, bt), scope->LG);
  return maybeItem;
}